

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaValidateFacets
              (xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node,xmlSchemaTypePtr type,
              xmlSchemaValType valType,xmlChar *value,xmlSchemaValPtr val,unsigned_long length,
              int fireErrors)

{
  bool bVar1;
  byte bVar2;
  xmlSchemaWhitespaceValueType fws;
  xmlParserErrors xVar3;
  int iVar4;
  int iVar5;
  xmlSchemaTypePtr pxVar6;
  char *message;
  xmlSchemaFacetLinkPtr pxVar7;
  xmlSchemaFacetLinkPtr pxVar8;
  xmlSchemaFacetPtr pxVar9;
  xmlSchemaFacetPtr *ppxVar10;
  xmlSchemaTypePtr pxVar11;
  undefined4 in_stack_ffffffffffffffa0;
  xmlParserErrors xVar12;
  unsigned_long len;
  
  len = 0;
  if (type->type == XML_SCHEMA_TYPE_BASIC) {
    return 0;
  }
  if (type->facetSet == (xmlSchemaFacetLinkPtr)0x0) {
    xVar12 = XML_ERR_OK;
  }
  else {
    pxVar7 = (xmlSchemaFacetLinkPtr)&type->facetSet;
    if (((uint)type->flags >> 8 & 1) == 0) {
      xVar12 = XML_ERR_OK;
      if ((type->flags & 0x40U) == 0) goto LAB_00199ebe;
    }
    else {
      pxVar11 = type;
      pxVar6 = xmlSchemaGetPrimitiveType(type);
      if ((pxVar6->builtInType == 1) ||
         ((fws = XML_SCHEMA_WHITESPACE_COLLAPSE, pxVar6->builtInType == 0x2e &&
          (pxVar6->type == XML_SCHEMA_TYPE_BASIC)))) {
        fws = xmlSchemaGetWhiteSpaceFacetValue(type);
      }
      type = pxVar11;
      if (val != (xmlSchemaValPtr)0x0) {
        valType = xmlSchemaGetValType(val);
      }
      pxVar8 = pxVar7;
      xVar12 = XML_ERR_OK;
      while (pxVar8 = pxVar8->next, pxVar8 != (xmlSchemaFacetLinkPtr)0x0) {
        pxVar9 = pxVar8->facet;
        if (2 < pxVar9->type - XML_SCHEMA_FACET_PATTERN) {
          if (pxVar9->type - XML_SCHEMA_FACET_LENGTH < 3) {
            xVar3 = xmlSchemaValidateLengthFacetWhtsp(pxVar9,valType,value,val,&len,fws);
          }
          else {
            xVar3 = xmlSchemaValidateFacetWhtsp(pxVar9,fws,valType,value,val,fws);
          }
          if ((int)xVar3 < 0) {
            message = "validating against a atomic type facet";
            goto LAB_0019a022;
          }
          if (xVar3 != XML_ERR_OK) {
            if (fireErrors == 0) {
              return xVar3;
            }
            xmlSchemaFacetErr(actxt,xVar3,node,value,len,type,pxVar8->facet,
                              (char *)CONCAT44(xVar12,in_stack_ffffffffffffffa0),value,
                              (xmlChar *)type);
            if (xVar12 == XML_ERR_OK) {
              xVar12 = xVar3;
            }
          }
        }
      }
      if ((type->flags & 0x40) == 0) goto LAB_00199ebe;
    }
    while (pxVar7 = pxVar7->next, pxVar7 != (xmlSchemaFacetLinkPtr)0x0) {
      if (pxVar7->facet->type - XML_SCHEMA_FACET_LENGTH < 3) {
        xVar3 = xmlSchemaValidateListSimpleTypeFacet
                          (pxVar7->facet,value,length,(unsigned_long *)0x0);
        if ((int)xVar3 < 0) {
          message = "validating against a list type facet";
LAB_0019a022:
          xmlSchemaInternalErr(actxt,"xmlSchemaValidateFacets",message);
          return -1;
        }
        if (xVar3 != XML_ERR_OK) {
          if (fireErrors == 0) {
            return xVar3;
          }
          xmlSchemaFacetErr(actxt,xVar3,node,value,length,type,pxVar7->facet,
                            (char *)CONCAT44(xVar12,in_stack_ffffffffffffffa0),value,(xmlChar *)type
                           );
          if (xVar12 == XML_ERR_OK) {
            xVar12 = xVar3;
          }
        }
      }
    }
  }
LAB_00199ebe:
  iVar5 = 0;
  pxVar11 = type;
  while( true ) {
    bVar1 = false;
    ppxVar10 = &type->facets;
    while (pxVar9 = *ppxVar10, pxVar9 != (xmlSchemaFacetPtr)0x0) {
      if (pxVar9->type == XML_SCHEMA_FACET_ENUMERATION) {
        iVar4 = xmlSchemaAreValuesEqual(pxVar9->val,val);
        if (iVar4 == 1) {
          iVar5 = 1;
          goto LAB_00199f1c;
        }
        bVar1 = true;
        if (iVar4 < 0) {
          message = "validating against an enumeration facet";
          goto LAB_0019a022;
        }
      }
      ppxVar10 = &pxVar9->next;
    }
    if (bVar1) break;
    type = type->baseType;
    if ((type == (xmlSchemaTypePtr)0x0) || (type->type == XML_SCHEMA_TYPE_BASIC)) goto LAB_00199f1c;
  }
  if (fireErrors == 0) {
    return 0x730;
  }
  iVar5 = 0x730;
  xmlSchemaFacetErr(actxt,XML_SCHEMAV_CVC_ENUMERATION_VALID,node,value,0,pxVar11,
                    (xmlSchemaFacetPtr)0x0,(char *)CONCAT44(xVar12,in_stack_ffffffffffffffa0),value,
                    (xmlChar *)pxVar11);
  if (xVar12 == XML_ERR_OK) {
    xVar12 = XML_SCHEMAV_CVC_ENUMERATION_VALID;
  }
LAB_00199f1c:
  pxVar9 = (xmlSchemaFacetPtr)0x0;
  pxVar6 = pxVar11;
  do {
    pxVar7 = (xmlSchemaFacetLinkPtr)&pxVar11->facetSet;
    bVar2 = 0;
    while (pxVar7 = pxVar7->next, pxVar7 != (xmlSchemaFacetLinkPtr)0x0) {
      if (pxVar7->facet->type == XML_SCHEMA_FACET_PATTERN) {
        iVar5 = xmlRegexpExec(pxVar7->facet->regexp,value);
        if (iVar5 == 1) {
          iVar5 = 1;
          goto LAB_00199f75;
        }
        if (iVar5 < 0) {
          message = "validating against a pattern facet";
          goto LAB_0019a022;
        }
        pxVar9 = pxVar7->facet;
        bVar2 = 1;
      }
    }
    if ((bool)(bVar2 & iVar5 != 1)) {
      if (fireErrors == 0) {
        xVar12 = XML_SCHEMAV_CVC_PATTERN_VALID;
      }
      else {
        xmlSchemaFacetErr(actxt,XML_SCHEMAV_CVC_PATTERN_VALID,node,value,0,pxVar6,pxVar9,
                          (char *)CONCAT44(xVar12,in_stack_ffffffffffffffa0),value,(xmlChar *)pxVar6
                         );
        if (xVar12 == XML_ERR_OK) {
          xVar12 = XML_SCHEMAV_CVC_PATTERN_VALID;
        }
      }
      return xVar12;
    }
LAB_00199f75:
    pxVar11 = pxVar11->baseType;
    if (pxVar11 == (xmlSchemaTypePtr)0x0) {
      return xVar12;
    }
    if (pxVar11->type == XML_SCHEMA_TYPE_BASIC) {
      return xVar12;
    }
  } while( true );
}

Assistant:

static int
xmlSchemaValidateFacets(xmlSchemaAbstractCtxtPtr actxt,
			xmlNodePtr node,
			xmlSchemaTypePtr type,
			xmlSchemaValType valType,
			const xmlChar * value,
			xmlSchemaValPtr val,
			unsigned long length,
			int fireErrors)
{
    int ret, error = 0, found;

    xmlSchemaTypePtr tmpType;
    xmlSchemaFacetLinkPtr facetLink;
    xmlSchemaFacetPtr facet;
    unsigned long len = 0;
    xmlSchemaWhitespaceValueType ws;

    /*
    * In Libxml2, derived built-in types have currently no explicit facets.
    */
    if (type->type == XML_SCHEMA_TYPE_BASIC)
	return (0);

    /*
    * NOTE: Do not jump away, if the facetSet of the given type is
    * empty: until now, "pattern" and "enumeration" facets of the
    * *base types* need to be checked as well.
    */
    if (type->facetSet == NULL)
	goto pattern_and_enum;

    if (! WXS_IS_ATOMIC(type)) {
	if (WXS_IS_LIST(type))
	    goto WXS_IS_LIST;
	else
	    goto pattern_and_enum;
    }

    /*
    * Whitespace handling is only of importance for string-based
    * types.
    */
    tmpType = xmlSchemaGetPrimitiveType(type);
    if ((tmpType->builtInType == XML_SCHEMAS_STRING) ||
	WXS_IS_ANY_SIMPLE_TYPE(tmpType)) {
	ws = xmlSchemaGetWhiteSpaceFacetValue(type);
    } else
	ws = XML_SCHEMA_WHITESPACE_COLLAPSE;

    /*
    * If the value was not computed (for string or
    * anySimpleType based types), then use the provided
    * type.
    */
    if (val != NULL)
	valType = xmlSchemaGetValType(val);

    ret = 0;
    for (facetLink = type->facetSet; facetLink != NULL;
	facetLink = facetLink->next) {
	/*
	* Skip the pattern "whiteSpace": it is used to
	* format the character content beforehand.
	*/
	switch (facetLink->facet->type) {
	    case XML_SCHEMA_FACET_WHITESPACE:
	    case XML_SCHEMA_FACET_PATTERN:
	    case XML_SCHEMA_FACET_ENUMERATION:
		continue;
	    case XML_SCHEMA_FACET_LENGTH:
	    case XML_SCHEMA_FACET_MINLENGTH:
	    case XML_SCHEMA_FACET_MAXLENGTH:
		ret = xmlSchemaValidateLengthFacetWhtsp(facetLink->facet,
		    valType, value, val, &len, ws);
		break;
	    default:
		ret = xmlSchemaValidateFacetWhtsp(facetLink->facet, ws,
		    valType, value, val, ws);
		break;
	}
	if (ret < 0) {
	    AERROR_INT("xmlSchemaValidateFacets",
		"validating against a atomic type facet");
	    return (-1);
	} else if (ret > 0) {
	    if (fireErrors)
		xmlSchemaFacetErr(actxt, ret, node,
		value, len, type, facetLink->facet, NULL, NULL, NULL);
	    else
		return (ret);
	    if (error == 0)
		error = ret;
	}
	ret = 0;
    }

WXS_IS_LIST:
    if (! WXS_IS_LIST(type))
	goto pattern_and_enum;
    /*
    * "length", "minLength" and "maxLength" of list types.
    */
    ret = 0;
    for (facetLink = type->facetSet; facetLink != NULL;
	facetLink = facetLink->next) {

	switch (facetLink->facet->type) {
	    case XML_SCHEMA_FACET_LENGTH:
	    case XML_SCHEMA_FACET_MINLENGTH:
	    case XML_SCHEMA_FACET_MAXLENGTH:
		ret = xmlSchemaValidateListSimpleTypeFacet(facetLink->facet,
		    value, length, NULL);
		break;
	    default:
		continue;
	}
	if (ret < 0) {
	    AERROR_INT("xmlSchemaValidateFacets",
		"validating against a list type facet");
	    return (-1);
	} else if (ret > 0) {
	    if (fireErrors)
		xmlSchemaFacetErr(actxt, ret, node,
		value, length, type, facetLink->facet, NULL, NULL, NULL);
	    else
		return (ret);
	    if (error == 0)
		error = ret;
	}
	ret = 0;
    }

pattern_and_enum:
    found = 0;
    /*
    * Process enumerations. Facet values are in the value space
    * of the defining type's base type. This seems to be a bug in the
    * XML Schema 1.0 spec. Use the whitespace type of the base type.
    * Only the first set of enumerations in the ancestor-or-self axis
    * is used for validation.
    */
    ret = 0;
    tmpType = type;
    do {
        for (facet = tmpType->facets; facet != NULL; facet = facet->next) {
            if (facet->type != XML_SCHEMA_FACET_ENUMERATION)
                continue;
            found = 1;
            ret = xmlSchemaAreValuesEqual(facet->val, val);
            if (ret == 1)
                break;
            else if (ret < 0) {
                AERROR_INT("xmlSchemaValidateFacets",
                    "validating against an enumeration facet");
                return (-1);
            }
        }
        if (ret != 0)
            break;
        /*
        * Break on the first set of enumerations. Any additional
        *  enumerations which might be existent on the ancestors
        *  of the current type are restricted by this set; thus
        *  *must* *not* be taken into account.
        */
        if (found)
            break;
        tmpType = tmpType->baseType;
    } while ((tmpType != NULL) &&
        (tmpType->type != XML_SCHEMA_TYPE_BASIC));
    if (found && (ret == 0)) {
        ret = XML_SCHEMAV_CVC_ENUMERATION_VALID;
        if (fireErrors) {
            xmlSchemaFacetErr(actxt, ret, node,
                value, 0, type, NULL, NULL, NULL, NULL);
        } else
            return (ret);
        if (error == 0)
            error = ret;
    }

    /*
    * Process patters. Pattern facets are ORed at type level
    * and ANDed if derived. Walk the base type axis.
    */
    tmpType = type;
    facet = NULL;
    do {
        found = 0;
        for (facetLink = tmpType->facetSet; facetLink != NULL;
            facetLink = facetLink->next) {
            if (facetLink->facet->type != XML_SCHEMA_FACET_PATTERN)
                continue;
            found = 1;
            /*
            * NOTE that for patterns, @value needs to be the
            * normalized value.
            */
            ret = xmlRegexpExec(facetLink->facet->regexp, value);
            if (ret == 1)
                break;
            else if (ret < 0) {
                AERROR_INT("xmlSchemaValidateFacets",
                    "validating against a pattern facet");
                return (-1);
            } else {
                /*
                * Save the last non-validating facet.
                */
                facet = facetLink->facet;
            }
        }
        if (found && (ret != 1)) {
            ret = XML_SCHEMAV_CVC_PATTERN_VALID;
            if (fireErrors) {
                xmlSchemaFacetErr(actxt, ret, node,
                    value, 0, type, facet, NULL, NULL, NULL);
            } else
                return (ret);
            if (error == 0)
                error = ret;
            break;
        }
        tmpType = tmpType->baseType;
    } while ((tmpType != NULL) && (tmpType->type != XML_SCHEMA_TYPE_BASIC));

    return (error);
}